

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

Edge * __thiscall Graph::findEdge(Graph *this,int originID,int destinyID)

{
  Edge *pEVar1;
  Vertex *pVVar2;
  
  pVVar2 = this->verticesList;
  do {
    if (pVVar2 == (Vertex *)0x0) {
      return (Edge *)0x0;
    }
    for (pEVar1 = pVVar2->edgesList; pEVar1 != (Edge *)0x0; pEVar1 = pEVar1->nextEdge) {
      if ((pEVar1->origin->id == originID) && (pEVar1->destiny->id == destinyID)) {
        return pEVar1;
      }
    }
    pVVar2 = pVVar2->nextVertex;
  } while( true );
}

Assistant:

Edge *Graph::findEdge(int originID, int destinyID){
    for(Vertex *v= get_verticesList(); v != NULL; v= v->getNext()){
        for(Edge *a= v->getEdgesList(); a != NULL; a= a->getNext()){
            if(a->getOrigin()->getID() == originID && a->getDestiny()->getID() == destinyID)
                return a;
        }
    }
    return NULL;
}